

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O0

int Abc_CommandReadWlc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  char *pcVar4;
  int fVerbose;
  int c;
  int fPrintTree;
  int fOldParser;
  char *pFileName;
  Wlc_Ntk_t *pNtk;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  c = 0;
  fVerbose = 0;
  bVar1 = false;
  Extra_UtilGetoptReset();
LAB_003a8c9f:
  iVar2 = Extra_UtilGetopt(argc,argv,"opvh");
  if (iVar2 == -1) {
    if (argc == globalUtilOptind + 1) {
      pcVar4 = argv[globalUtilOptind];
      __stream = fopen(pcVar4,"r");
      if (__stream == (FILE *)0x0) {
        Abc_Print(1,"Cannot open input file \"%s\". ",pcVar4);
        pcVar4 = Extra_FileGetSimilarName(pcVar4,".v",".smt",".smt2",(char *)0x0,(char *)0x0);
        if (pcVar4 != (char *)0x0) {
          Abc_Print(1,"Did you mean \"%s\"?",pcVar4);
        }
        Abc_Print(1,"\n");
      }
      else {
        fclose(__stream);
        pcVar3 = Extra_FileNameExtension(pcVar4);
        iVar2 = strcmp(pcVar3,"v");
        if (iVar2 == 0) {
          pFileName = (char *)Wlc_ReadVer(pcVar4);
        }
        else {
          pcVar3 = Extra_FileNameExtension(pcVar4);
          iVar2 = strcmp(pcVar3,"smt");
          if (iVar2 != 0) {
            pcVar3 = Extra_FileNameExtension(pcVar4);
            iVar2 = strcmp(pcVar3,"smt2");
            if (iVar2 != 0) {
              printf("Abc_CommandReadWlc(): Unknown file extension.\n");
              return 0;
            }
          }
          pFileName = (char *)Wlc_ReadSmt(pcVar4,c,fVerbose);
        }
        Wlc_AbcUpdateNtk(pAbc,(Wlc_Ntk_t *)pFileName);
      }
    }
    else {
      printf("Abc_CommandReadWlc(): Input file name should be given on the command line.\n");
    }
    return 0;
  }
  switch(iVar2) {
  case 0x68:
    break;
  default:
    break;
  case 0x6f:
    fVerbose = fVerbose ^ 1;
    goto LAB_003a8c9f;
  case 0x70:
    c = c ^ 1;
    goto LAB_003a8c9f;
  case 0x76:
    goto switchD_003a8cdd_caseD_76;
  }
  Abc_Print(-2,"usage: %%read [-opvh] <file_name>\n");
  Abc_Print(-2,"\t         reads word-level design from Verilog file\n");
  pcVar4 = "no";
  if (c != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-o     : toggle using old SMT-LIB parser [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (fVerbose != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-p     : toggle printing parse SMT-LIB tree [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_003a8cdd_caseD_76:
  bVar1 = (bool)(bVar1 ^ 1);
  goto LAB_003a8c9f;
}

Assistant:

int Abc_CommandReadWlc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Wlc_Ntk_t * pNtk = NULL;
    char * pFileName = NULL;
    int fOldParser   =    0;
    int fPrintTree   =    0;
    int c, fVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "opvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'o':
            fPrintTree ^= 1;
            break;
        case 'p':
            fOldParser ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        printf( "Abc_CommandReadWlc(): Input file name should be given on the command line.\n" );
        return 0;
    }
    // get the file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "r" )) == NULL )
    {
        Abc_Print( 1, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".v", ".smt", ".smt2", NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", pFileName );
        Abc_Print( 1, "\n" );
        return 0;
    }
    fclose( pFile );

    // perform reading
    if ( !strcmp( Extra_FileNameExtension(pFileName), "v" )  )
        pNtk = Wlc_ReadVer( pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "smt" ) || !strcmp( Extra_FileNameExtension(pFileName), "smt2" )  )
        pNtk = Wlc_ReadSmt( pFileName, fOldParser, fPrintTree );
    else
    {
        printf( "Abc_CommandReadWlc(): Unknown file extension.\n" );
        return 0;
    }
    Wlc_AbcUpdateNtk( pAbc, pNtk );
    return 0;
usage:
    Abc_Print( -2, "usage: %%read [-opvh] <file_name>\n" );
    Abc_Print( -2, "\t         reads word-level design from Verilog file\n" );
    Abc_Print( -2, "\t-o     : toggle using old SMT-LIB parser [default = %s]\n", fOldParser? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle printing parse SMT-LIB tree [default = %s]\n", fPrintTree? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}